

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mprog.c
# Opt level: O1

void fight_prog_gking(CHAR_DATA *mob,CHAR_DATA *victim)

{
  bool bVar1;
  MOB_INDEX_DATA *pMVar2;
  CHAR_DATA *ch;
  CHAR_DATA *ch_00;
  AFFECT_DATA af;
  AFFECT_DATA local_90;
  
  if (((mob->hit * 100) / (int)mob->max_hit < 0x4b) &&
     (bVar1 = is_affected(mob,(int)gsn_gking), !bVar1)) {
    init_affect(&local_90);
    local_90.where = 0;
    local_90.type = gsn_gking;
    local_90.aftype = 1;
    local_90.level = 0x33;
    local_90.duration = 0xf;
    affect_to_char(mob,&local_90);
    pMVar2 = get_mob_index(0);
    ch = create_mobile(pMVar2);
    pMVar2 = get_mob_index(0);
    ch_00 = create_mobile(pMVar2);
    act("$n gestures slightly animating the two mithril statues next to the throne!",mob,(void *)0x0
        ,(void *)0x0,0);
    char_to_room(ch,mob->in_room);
    char_to_room(ch_00,mob->in_room);
    act("$n screams and attacks you!",ch,(void *)0x0,victim,2);
    act("$n screams and attacks $N!",ch,(void *)0x0,victim,1);
    do_murder(ch,victim->name);
    act("$n screams and attacks you!",ch_00,(void *)0x0,victim,2);
    act("$n screams and attacks $N!",ch_00,(void *)0x0,victim,1);
    do_murder(ch_00,victim->name);
  }
  return;
}

Assistant:

void fight_prog_gking(CHAR_DATA *mob, CHAR_DATA *victim)
{
	CHAR_DATA *gar1, *gar2;
	AFFECT_DATA af;

	if ((mob->hit * 100 / mob->max_hit) < 75 && !is_affected(mob, gsn_gking))
	{
		init_affect(&af);
		af.where = TO_AFFECTS;
		af.type = gsn_gking;
		af.aftype = AFT_SKILL;
		af.level = 51;
		af.duration = 15;
		affect_to_char(mob, &af);

		gar1 = create_mobile(get_mob_index(2233));
		gar2 = create_mobile(get_mob_index(2233));

		act("$n gestures slightly animating the two mithril statues next to the throne!", mob, 0, 0, TO_ROOM);

		char_to_room(gar1, mob->in_room);
		char_to_room(gar2, mob->in_room);

		act("$n screams and attacks you!", gar1, 0, victim, TO_VICT);
		act("$n screams and attacks $N!", gar1, 0, victim, TO_NOTVICT);

		do_murder(gar1, victim->name);

		act("$n screams and attacks you!", gar2, 0, victim, TO_VICT);
		act("$n screams and attacks $N!", gar2, 0, victim, TO_NOTVICT);

		do_murder(gar2, victim->name);
	}
}